

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> __thiscall
kj::anon_unknown_9::DiskHandle::tryOpenFile(DiskHandle *this,PathPtr path)

{
  OwnFd *other;
  ReadableFile *extraout_RDX;
  ReadableFile *extraout_RDX_00;
  ReadableFile *extraout_RDX_01;
  ReadableFile *pRVar1;
  Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> MVar2;
  OwnFd local_84;
  undefined1 local_80 [24];
  OwnFd result;
  Fault local_58;
  Fault f;
  undefined1 auStack_48 [4];
  int error;
  String *local_40;
  PathPtr *local_38;
  int local_30;
  int local_2c;
  int _kjSyscallError;
  int newFd;
  DiskHandle *this_local;
  PathPtr path_local;
  
  this_local = (DiskHandle *)path.parts.size_;
  local_40 = path.parts.ptr;
  _auStack_48 = (Event **)&local_2c;
  local_38 = (PathPtr *)&this_local;
  __kjSyscallError = local_40;
  path_local.parts.size_ = (size_t)this;
  f.exception._4_4_ =
       kj::_::Debug::
       syscallError<kj::(anonymous_namespace)::DiskHandle::tryOpenFile(kj::PathPtr)const::_lambda()_1_>
                 ((anon_class_24_3_ffa5648e *)auStack_48,false);
  local_30 = f.exception._4_4_;
  if (f.exception._4_4_ == 0) {
    OwnFd::OwnFd((OwnFd *)(local_80 + 0x10),local_2c);
    other = mv<kj::OwnFd>((OwnFd *)(local_80 + 0x10));
    OwnFd::OwnFd(&local_84,other);
    newDiskReadableFile((kj *)local_80,&local_84);
    Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_>::Maybe<kj::ReadableFile>
              ((Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> *)this,
               (Own<kj::ReadableFile,_std::nullptr_t> *)local_80);
    Own<kj::ReadableFile,_std::nullptr_t>::~Own((Own<kj::ReadableFile,_std::nullptr_t> *)local_80);
    OwnFd::~OwnFd(&local_84);
    OwnFd::~OwnFd((OwnFd *)(local_80 + 0x10));
    pRVar1 = extraout_RDX_01;
  }
  else if ((f.exception._4_4_ == 2) || (f.exception._4_4_ == 0x14)) {
    Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_>::Maybe
              ((Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> *)this);
    pRVar1 = extraout_RDX;
  }
  else {
    kj::_::Debug::Fault::Fault<int,kj::PathPtr&>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x302,f.exception._4_4_,"openat(fd, path, O_RDONLY)","path",(PathPtr *)&this_local);
    Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_>::Maybe
              ((Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> *)this);
    kj::_::Debug::Fault::~Fault(&local_58);
    pRVar1 = extraout_RDX_00;
  }
  MVar2.ptr.ptr = pRVar1;
  MVar2.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_>)MVar2.ptr;
}

Assistant:

Maybe<Own<const ReadableFile>> tryOpenFile(PathPtr path) const {
    int newFd;
    KJ_SYSCALL_HANDLE_ERRORS(newFd = openat(
        fd, path.toString().cStr(), O_RDONLY | MAYBE_O_CLOEXEC)) {
      case ENOENT:
      case ENOTDIR:
        return kj::none;
      default:
        KJ_FAIL_SYSCALL("openat(fd, path, O_RDONLY)", error, path) { return kj::none; }
    }

    kj::OwnFd result(newFd);
#ifndef O_CLOEXEC
    setCloexec(result);
#endif

    return newDiskReadableFile(kj::mv(result));
  }